

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

shared_ptr<duckdb::Binder,_true> __thiscall
duckdb::Binder::CreateBinder
          (Binder *this,ClientContext *context,optional_ptr<duckdb::Binder,_true> parent,
          BinderType binder_type)

{
  Binder *pBVar1;
  idx_t iVar2;
  BinderException *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  bool bVar3;
  shared_ptr<duckdb::Binder,_true> sVar4;
  allocator local_61;
  optional_ptr<duckdb::Binder,_true> parent_local;
  enable_shared_from_this<duckdb::Binder> local_58;
  string local_48;
  
  parent_local.ptr = parent.ptr;
  if (parent.ptr == (Binder *)0x0) {
    bVar3 = true;
  }
  else {
    pBVar1 = optional_ptr<duckdb::Binder,_true>::operator->(&parent_local);
    iVar2 = GetBinderDepth(pBVar1);
    if ((context->config).max_expression_depth < iVar2) {
      this_00 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_48,
                 "Max expression depth limit of %lld exceeded. Use \"SET max_expression_depth TO x\" to increase the maximum expression depth."
                 ,&local_61);
      BinderException::BinderException<unsigned_long>
                (this_00,&local_48,(context->config).max_expression_depth);
      __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar3 = parent_local.ptr == (Binder *)0x0;
  }
  pBVar1 = (Binder *)operator_new(0x3b0);
  if (bVar3) {
    local_58.__weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_58.__weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    optional_ptr<duckdb::Binder,_true>::operator->(&parent_local);
    enable_shared_from_this<duckdb::Binder>::shared_from_this(&local_58);
  }
  Binder(pBVar1,context,(shared_ptr<duckdb::Binder,_true> *)&local_58,binder_type);
  shared_ptr<duckdb::Binder,_true>::shared_ptr<duckdb::Binder,_0>
            ((shared_ptr<duckdb::Binder,_true> *)this,pBVar1);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_58.__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar4.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Binder,_true>)
         sVar4.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Binder> Binder::CreateBinder(ClientContext &context, optional_ptr<Binder> parent, BinderType binder_type) {
	auto depth = parent ? parent->GetBinderDepth() : 0;
	if (depth > context.config.max_expression_depth) {
		throw BinderException("Max expression depth limit of %lld exceeded. Use \"SET max_expression_depth TO x\" to "
		                      "increase the maximum expression depth.",
		                      context.config.max_expression_depth);
	}
	return shared_ptr<Binder>(new Binder(context, parent ? parent->shared_from_this() : nullptr, binder_type));
}